

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O3

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  pointer puVar2;
  pointer puVar3;
  unsigned_long uVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  pointer pVVar10;
  ulong uVar11;
  pointer pVVar12;
  ulong uVar13;
  ulong uVar14;
  size_type __new_size;
  size_t i_column_sweep;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  size_t i_row_sweep;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Scalar max;
  Scalar absA;
  Scalar local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  double local_58;
  long local_50;
  pointer local_48;
  pointer pdStack_40;
  
  this->factorised = false;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  operator=(&(this->lu_factorised).
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ,&a_matrix->
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           );
  local_60 = &this->pivots;
  pVVar10 = (this->lu_factorised).
            super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            .
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar10 ==
      (this->lu_factorised).
      super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      .
      super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __new_size = 0;
  }
  else {
    __new_size = (long)(pVVar10->super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pVVar10->super_vector<double,_std::allocator<double>_>).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_60,__new_size);
  auVar8 = _DAT_0013f050;
  puVar2 = (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->pivots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 != puVar3) {
    uVar11 = (long)puVar3 + (-8 - (long)puVar2);
    auVar21._8_4_ = (int)uVar11;
    auVar21._0_8_ = uVar11;
    auVar21._12_4_ = (int)(uVar11 >> 0x20);
    auVar19._0_8_ = uVar11 >> 3;
    auVar19._8_8_ = auVar21._8_8_ >> 3;
    uVar14 = 0;
    auVar19 = auVar19 ^ _DAT_0013f050;
    auVar20 = _DAT_0013f040;
    do {
      auVar21 = auVar20 ^ auVar8;
      if ((bool)(~(auVar21._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar21._0_4_ ||
                  auVar19._4_4_ < auVar21._4_4_) & 1)) {
        puVar2[uVar14] = uVar14;
      }
      if ((auVar21._12_4_ != auVar19._12_4_ || auVar21._8_4_ <= auVar19._8_4_) &&
          auVar21._12_4_ <= auVar19._12_4_) {
        puVar2[uVar14 + 1] = uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar17 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar17 + 2;
    } while (((uVar11 >> 3) + 2 & 0xfffffffffffffffe) != uVar14);
  }
  pVVar10 = (this->lu_factorised).
            super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            .
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar12 = (this->lu_factorised).
            super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            .
            super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar12 != pVVar10) {
    lVar17 = 0;
    uVar11 = 0;
    do {
      local_68 = 0.0;
      uVar14 = uVar11;
      uVar18 = uVar11;
      local_50 = lVar17;
      while( true ) {
        if (pVVar10 == pVVar12) {
          uVar13 = 0;
        }
        else {
          uVar13 = (long)(pVVar10->super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pVVar10->super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
        }
        if (uVar13 <= uVar18) break;
        local_58 = ABS(*(double *)
                        (*(long *)((long)&(pVVar10->super_vector<double,_std::allocator<double>_>).
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + lVar17) +
                        uVar11 * 8));
        if ((local_68 <= local_58) &&
           (bVar9 = is_nearly_equal(&local_58,&local_68,(Scalar *)&default_relative,
                                    (Scalar *)&default_absolute), !bVar9)) {
          local_68 = local_58;
          uVar14 = uVar18;
        }
        uVar18 = uVar18 + 1;
        pVVar10 = (this->lu_factorised).
                  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  .
                  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar12 = (this->lu_factorised).
                  super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  .
                  super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        lVar17 = lVar17 + 0x18;
      }
      if (uVar14 != uVar11) {
        puVar2 = (local_60->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar4 = puVar2[uVar11];
        puVar2[uVar11] = puVar2[uVar14];
        puVar2[uVar14] = uVar4;
        pvVar1 = &pVVar10[uVar11].super_vector<double,_std::allocator<double>_>;
        pVVar10 = pVVar10 + uVar14;
        pdVar5 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        local_48 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        pdStack_40 = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
        (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::_M_move_assign(pvVar1,pVVar10);
        pdVar6 = (pVVar10->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar7 = (pVVar10->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage;
        (pVVar10->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
             = local_48;
        (pVVar10->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = pdStack_40;
        (pVVar10->super_vector<double,_std::allocator<double>_>).
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pdVar5;
        if (pdVar6 != (pointer)0x0) {
          operator_delete(pdVar6,(long)pdVar7 - (long)pdVar6);
        }
      }
      pVVar10 = (this->lu_factorised).
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar5 = pVVar10[uVar11].super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (ABS(pdVar5[uVar11]) < this->factorisation_tolerance) {
        return false;
      }
      pVVar12 = (this->lu_factorised).
                super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                .
                super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar13 = ((long)pVVar12 - (long)pVVar10 >> 3) * -0x5555555555555555;
      uVar14 = uVar11 + 1;
      for (uVar18 = uVar14; uVar18 < uVar13; uVar18 = uVar18 + 1) {
        pdVar6 = pVVar10[uVar18].super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar6[uVar11] = pdVar6[uVar11] / pdVar5[uVar11];
        uVar15 = uVar14;
        while( true ) {
          if (pVVar10 == pVVar12) {
            uVar16 = 0;
          }
          else {
            uVar16 = (long)(pVVar10->super_vector<double,_std::allocator<double>_>).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pVVar10->super_vector<double,_std::allocator<double>_>).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3;
          }
          if (uVar16 <= uVar15) break;
          pdVar6[uVar15] = pdVar6[uVar15] - pdVar6[uVar11] * pdVar5[uVar15];
          uVar15 = uVar15 + 1;
        }
      }
      lVar17 = local_50 + 0x18;
      uVar11 = uVar14;
    } while (uVar14 < uVar13);
  }
  this->factorised = true;
  return true;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}